

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubf1.c
# Opt level: O3

LispPTR N_OP_ubfloat1(LispPTR arg,int alpha)

{
  ulong uVar1;
  ushort uVar2;
  uint *puVar3;
  uint type;
  
  uVar1 = (ulong)arg;
  switch(alpha) {
  case 0:
    type = 3;
    break;
  case 1:
    if ((arg & 0xfff0000) == 0xf0000) {
      return (LispPTR)(float)(int)(arg | 0xffff0000);
    }
    if ((arg & 0xfff0000) == 0xe0000) {
      return (LispPTR)(float)(arg & 0xffff);
    }
    uVar2 = *(ushort *)((ulong)(arg >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar2 == 2) {
      if ((arg & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
      }
      return (LispPTR)(float)*(int *)(Lisp_world + uVar1);
    }
    if (uVar2 != 3) {
      MachineState.tosvalue = arg;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((arg & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
    }
    return *(LispPTR *)(Lisp_world + uVar1);
  case 2:
    return arg & 0x7fffffff;
  case 3:
    return arg + 0x80000000;
  case 4:
    if ((float)arg != 2.1474836e+09) {
      MachineState.tosvalue = arg;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    arg = (LispPTR)(float)arg;
    if ((arg & 0xffff0000) == 0xffff0000) {
      return arg & 0xffff | 0xf0000;
    }
    if ((arg & 0xffff0000) == 0) {
      return arg | 0xe0000;
    }
    type = 2;
    break;
  default:
    MachineState.tosvalue = arg;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  puVar3 = (uint *)createcell68k(type);
  *puVar3 = arg;
  if (((ulong)puVar3 & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",puVar3);
  }
  return (LispPTR)((ulong)((long)puVar3 - (long)Lisp_world) >> 1);
}

Assistant:

LispPTR N_OP_ubfloat1(LispPTR arg, int alpha) {
  switch (alpha) {
    case 0: /* box */
    {
      LispPTR *wordp;
      wordp = createcell68k(TYPE_FLOATP);
      *wordp = arg;
      return (LAddrFromNative(wordp));
    }
    case 1: /* unbox */
    {
      float dest;
      LispPTR ret;
      N_MakeFloat(arg, dest, arg);
      ret = *(LispPTR *)&dest;
      return (ret);
    }
    case 2: /* abs */ return (0x7FFFFFFF & arg);
    case 3: /* neg */ return (0x80000000 ^ arg);
    case 4: /* ufix */
    {
      float temp;
      int val;
      temp = *(float *)&arg;
      if ((temp > ((float)0x7fffffff)) || (temp < ((float)0x80000000))) ERROR_EXIT(arg);
      val = (int)temp;
      N_ARITH_SWITCH(val);
    }
    default: ERROR_EXIT(arg);
  } /* end switch */
}